

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::get_arr_int
          (clip_model_loader *this,string *key,vector<int,_std::allocator<int>_> *output,
          bool required)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  pointer pgVar4;
  undefined8 uVar5;
  runtime_error *this_00;
  long lVar6;
  reference pvVar7;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  int i_1;
  int32_t *values;
  int n;
  int i;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  pgVar4 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff80);
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = gguf_find_key(pgVar4,uVar5);
  if (iVar2 < 0) {
    if ((in_CL & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffc0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pgVar4 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff80);
    iVar3 = gguf_get_arr_n(pgVar4,(long)iVar2);
    std::vector<int,_std::allocator<int>_>::resize
              (in_stack_ffffffffffffffa0,
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pgVar4 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_stack_ffffffffffffff80);
    lVar6 = gguf_get_arr_data(pgVar4,(long)iVar2);
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      vVar1 = *(value_type *)(lVar6 + (long)iVar2 * 4);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar2);
      *pvVar7 = vVar1;
    }
  }
  return;
}

Assistant:

void get_arr_int(const std::string & key, std::vector<int> & output, bool required = true) {
        const int i = gguf_find_key(ctx_gguf.get(), key.c_str());
        if (i < 0) {
            if (required) throw std::runtime_error("Key not found: " + key);
            return;
        }
        int n = gguf_get_arr_n(ctx_gguf.get(), i);
        output.resize(n);
        const int32_t * values = (const int32_t *)gguf_get_arr_data(ctx_gguf.get(), i);
        for (int i = 0; i < n; ++i) {
            output[i] = values[i];
        }
    }